

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O1

int readOperands(InternalInstruction *insn)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  Reg RVar4;
  ulong uVar5;
  Reg RVar6;
  int iVar7;
  uint8_t size;
  long lVar8;
  OperandSpecifier (*paOVar9) [6];
  bool bVar10;
  bool bVar11;
  
  bVar10 = false;
  switch(insn->vectorExtensionType) {
  case TYPE_VEX_2B:
    bVar2 = insn->vectorExtensionPrefix[1];
    break;
  case TYPE_VEX_3B:
  case TYPE_XOP:
    bVar2 = insn->vectorExtensionPrefix[2];
    break;
  case TYPE_EVEX:
    bVar2 = (insn->vectorExtensionPrefix[2] >> 3 & 0xf |
            insn->vectorExtensionPrefix[3] * '\x02' & 0x10) ^ 0x1f;
    goto LAB_0023a606;
  default:
    bVar1 = false;
    goto LAB_0023a620;
  }
  bVar2 = (byte)~bVar2 >> 3 & 0xf;
LAB_0023a606:
  RVar4 = bVar2 & MODRM_REG_BH;
  if (insn->mode == MODE_64BIT) {
    RVar4 = (uint)bVar2;
  }
  insn->vvvv = RVar4;
  bVar1 = true;
LAB_0023a620:
  if (bVar1) {
    bVar10 = insn->vvvv != MODRM_REG_AL;
  }
  paOVar9 = x86OperandSets;
  lVar8 = 6;
  bVar11 = false;
  iVar7 = -1;
  do {
    uVar5 = (ulong)insn->spec->operands;
    switch(((OperandSpecifier *)((long)paOVar9 + uVar5 * 6 * 2))->encoding) {
    case '\0':
    case '\x19':
    case '\x1d':
    case '\x1e':
    case '\x1f':
      break;
    case '\x01':
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
    case '\a':
    case '\b':
      iVar3 = readModRM(insn);
      if (iVar3 != 0) {
        return -1;
      }
      iVar3 = fixupReg(insn,(OperandSpecifier *)
                            ((long)paOVar9 + (ulong)insn->spec->operands * 6 * 2));
      if (iVar3 != 0) {
        return -1;
      }
      if ((((OperandSpecifier *)((long)paOVar9 + (ulong)insn->spec->operands * 6 * 2))->encoding !=
           '\x01') && (insn->eaDisplacement == EA_DISP_8)) {
        insn->displacement =
             insn->displacement <<
             (((OperandSpecifier *)((long)paOVar9 + (ulong)insn->spec->operands * 6 * 2))->encoding
              - 2 & 0x3f);
      }
      break;
    case '\t':
      if (!bVar1) {
        return -1;
      }
      iVar3 = fixupReg(insn,(OperandSpecifier *)((long)paOVar9 + uVar5 * 6 * 2));
      bVar10 = false;
      goto LAB_0023a8a6;
    case '\n':
      if (insn->vectorExtensionType != TYPE_EVEX) {
        return -1;
      }
      insn->writemask = insn->vectorExtensionPrefix[3] & MODRM_REG_BH;
      break;
    default:
      goto switchD_0023a67b_caseD_b;
    case '\x11':
      if (bVar11) {
        bVar2 = insn->numImmediatesConsumed;
        insn->immediates[bVar2] = (ulong)((uint)insn->immediates[(ulong)bVar2 - 1] & 0xf);
        insn->numImmediatesConsumed = bVar2 + 1;
        bVar11 = true;
      }
      else {
        iVar3 = readImmediate(insn,'\x01');
        if (iVar3 != 0) {
          return -1;
        }
        bVar11 = (((OperandSpecifier *)((long)paOVar9 + (ulong)insn->spec->operands * 6 * 2))->type
                 & 0xfe) == 0x38;
      }
      break;
    case '\x12':
      size = '\x02';
      goto LAB_0023a8a1;
    case '\x13':
      size = '\x04';
      goto LAB_0023a8a1;
    case '\x14':
      size = '\b';
      goto LAB_0023a8a1;
    case '\x15':
      insn->operandSize = '\x01';
switchD_0023a7a4_caseD_1:
      RVar6 = *(int *)&insn->rexPrefix * 8 & MODRM_REG_R8B;
      RVar4 = insn->opcode & MODRM_REG_BH | RVar6;
      insn->opcodeRegister = RVar4;
      if (((RVar6 == MODRM_REG_AL) && ((char)*(int *)&insn->rexPrefix != '\0')) && (3 < (byte)RVar4)
         ) {
        RVar4 = RVar4 + MODRM_REG_R12B;
        goto LAB_0023a85e;
      }
      break;
    case '\x16':
      insn->operandSize = '\x02';
switchD_0023a7a4_caseD_2:
      RVar4 = (insn->opcode & 7) + (*(uint *)&insn->rexPrefix & 1) * 8 + MODRM_REG_AX;
      goto LAB_0023a85e;
    case '\x17':
      insn->operandSize = '\x04';
switchD_0023a7a4_caseD_4:
      RVar4 = (insn->opcode & 7) + (*(uint *)&insn->rexPrefix & 1) * 8 + MODRM_REG_EAX;
      goto LAB_0023a85e;
    case '\x18':
      insn->operandSize = '\b';
switchD_0023a7a4_caseD_8:
      RVar4 = (insn->opcode & 7) + (*(uint *)&insn->rexPrefix & 1) * 8 + MODRM_REG_RAX;
LAB_0023a85e:
      insn->opcodeRegister = RVar4;
      break;
    case '\x1a':
      size = insn->immediateSize;
LAB_0023a8a1:
      iVar3 = readImmediate(insn,size);
LAB_0023a8a6:
      if (iVar3 != 0) {
        return -1;
      }
      break;
    case '\x1b':
      iVar3 = readImmediate(insn,insn->addressSize);
      if (iVar3 != 0) {
        return -1;
      }
      insn->displacementOffset = insn->immediateOffset;
      insn->consumedDisplacement = true;
      insn->displacementSize = insn->immediateSize;
      insn->displacement = insn->immediates[(ulong)insn->numImmediatesConsumed - 1];
      insn->immediateOffset = '\0';
      insn->immediateSize = '\0';
      break;
    case '\x1c':
      insn->operandSize = insn->registerSize;
      switch(insn->registerSize) {
      case '\x01':
        goto switchD_0023a7a4_caseD_1;
      case '\x02':
        goto switchD_0023a7a4_caseD_2;
      case '\x04':
        goto switchD_0023a7a4_caseD_4;
      case '\b':
        goto switchD_0023a7a4_caseD_8;
      }
    }
    paOVar9 = (OperandSpecifier (*) [6])((long)paOVar9 + 2);
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  iVar7 = -(uint)bVar10;
switchD_0023a67b_caseD_b:
  return iVar7;
}

Assistant:

static int readOperands(struct InternalInstruction *insn)
{
	int index;
	int hasVVVV, needVVVV;
	int sawRegImm = 0;

	// printf(">>> readOperands(): ID = %u\n", insn->instructionID);
	/* If non-zero vvvv specified, need to make sure one of the operands
	   uses it. */
	hasVVVV = !readVVVV(insn);
	needVVVV = hasVVVV && (insn->vvvv != 0);

	for (index = 0; index < X86_MAX_OPERANDS; ++index) {
		//printf(">>> encoding[%u] = %u\n", index, x86OperandSets[insn->spec->operands][index].encoding);
		switch (x86OperandSets[insn->spec->operands][index].encoding) {
			case ENCODING_NONE:
			case ENCODING_SI:
			case ENCODING_DI:
				break;
			case ENCODING_REG:
			CASE_ENCODING_RM:
				if (readModRM(insn))
					return -1;
				if (fixupReg(insn, &x86OperandSets[insn->spec->operands][index]))
					return -1;
				// Apply the AVX512 compressed displacement scaling factor.
				if (x86OperandSets[insn->spec->operands][index].encoding != ENCODING_REG && insn->eaDisplacement == EA_DISP_8)
					insn->displacement *= (int64_t)1 << (x86OperandSets[insn->spec->operands][index].encoding - ENCODING_RM);
				break;
			case ENCODING_CB:
			case ENCODING_CW:
			case ENCODING_CD:
			case ENCODING_CP:
			case ENCODING_CO:
			case ENCODING_CT:
				// dbgprintf(insn, "We currently don't hande code-offset encodings");
				return -1;
			case ENCODING_IB:
				if (sawRegImm) {
					/* Saw a register immediate so don't read again and instead split the
					   previous immediate.  FIXME: This is a hack. */
					insn->immediates[insn->numImmediatesConsumed] =
						insn->immediates[insn->numImmediatesConsumed - 1] & 0xf;
					++insn->numImmediatesConsumed;
					break;
				}
				if (readImmediate(insn, 1))
					return -1;
				if (x86OperandSets[insn->spec->operands][index].type == TYPE_XMM128 ||
						x86OperandSets[insn->spec->operands][index].type == TYPE_XMM256)
					sawRegImm = 1;
				break;
			case ENCODING_IW:
				if (readImmediate(insn, 2))
					return -1;
				break;
			case ENCODING_ID:
				if (readImmediate(insn, 4))
					return -1;
				break;
			case ENCODING_IO:
				if (readImmediate(insn, 8))
					return -1;
				break;
			case ENCODING_Iv:
				if (readImmediate(insn, insn->immediateSize))
					return -1;
				break;
			case ENCODING_Ia:
				if (readImmediate(insn, insn->addressSize))
					return -1;
				/* Direct memory-offset (moffset) immediate will get mapped
				   to memory operand later. We want the encoding info to
				   reflect that as well. */
				insn->displacementOffset = insn->immediateOffset;
				insn->consumedDisplacement = true;
				insn->displacementSize = insn->immediateSize;
				insn->displacement = insn->immediates[insn->numImmediatesConsumed - 1];
				insn->immediateOffset = 0;
				insn->immediateSize = 0;
				break;
			case ENCODING_RB:
				if (readOpcodeRegister(insn, 1))
					return -1;
				break;
			case ENCODING_RW:
				if (readOpcodeRegister(insn, 2))
					return -1;
				break;
			case ENCODING_RD:
				if (readOpcodeRegister(insn, 4))
					return -1;
				break;
			case ENCODING_RO:
				if (readOpcodeRegister(insn, 8))
					return -1;
				break;
			case ENCODING_Rv:
				if (readOpcodeRegister(insn, 0))
					return -1;
				break;
			case ENCODING_FP:
				break;
			case ENCODING_VVVV:
				needVVVV = 0; /* Mark that we have found a VVVV operand. */
				if (!hasVVVV)
					return -1;
				if (fixupReg(insn, &x86OperandSets[insn->spec->operands][index]))
					return -1;
				break;
			case ENCODING_WRITEMASK:
				if (readMaskRegister(insn))
					return -1;
				break;
			case ENCODING_DUP:
				break;
			default:
				// dbgprintf(insn, "Encountered an operand with an unknown encoding.");
				return -1;
		}
	}

	/* If we didn't find ENCODING_VVVV operand, but non-zero vvvv present, fail */
	if (needVVVV) return -1;

	return 0;
}